

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

path * AbsPathForConfigVal(ArgsManager *args,path *path,bool net_specific)

{
  long lVar1;
  bool bVar2;
  byte in_CL;
  path *in_RSI;
  ArgsManager *in_RDI;
  long in_FS_OFFSET;
  path *in_stack_ffffffffffffff88;
  ArgsManager *this;
  ArgsManager *base;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  base = in_RDI;
  bVar2 = std::filesystem::__cxx11::path::is_absolute(in_stack_ffffffffffffff88);
  if (bVar2) {
    fs::path::path((path *)in_stack_ffffffffffffff88,(path *)0x192b29);
  }
  else {
    if ((in_CL & 1) == 0) {
      ArgsManager::GetDataDirBase(this);
    }
    else {
      ArgsManager::GetDataDirNet(this);
    }
    fsbridge::AbsPathJoin((path *)base,in_RSI);
    fs::path::~path((path *)in_stack_ffffffffffffff88);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (path *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

fs::path AbsPathForConfigVal(const ArgsManager& args, const fs::path& path, bool net_specific)
{
    if (path.is_absolute()) {
        return path;
    }
    return fsbridge::AbsPathJoin(net_specific ? args.GetDataDirNet() : args.GetDataDirBase(), path);
}